

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_isotropic(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *hh)

{
  REF_NODE ref_node_00;
  uint uVar1;
  REF_DBL *metric_00;
  double dVar2;
  double dVar3;
  double local_1a8;
  double local_1a0;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_DBL ar;
  REF_DBL h;
  REF_DBL d_met [12];
  REF_DBL hmax;
  REF_DBL hmin;
  REF_DBL d_imply [12];
  REF_DBL local_50;
  REF_DBL e;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *metric_imply;
  REF_INT node;
  REF_NODE ref_node;
  REF_DBL *hh_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_node_00 = ref_grid->node;
  if (ref_grid->node->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xda1,
           "ref_metric_isotropic","malloc metric_imply of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    metric_00 = (REF_DBL *)malloc((long)(ref_grid->node->max * 6) << 3);
    if (metric_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xda1,"ref_metric_isotropic","malloc metric_imply of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else {
      metric_local._4_4_ = ref_metric_imply_from(metric_00,ref_grid);
      if (metric_local._4_4_ == 0) {
        for (metric_imply._4_4_ = 0; metric_imply._4_4_ < ref_node_00->max;
            metric_imply._4_4_ = metric_imply._4_4_ + 1) {
          if (((-1 < metric_imply._4_4_) && (metric_imply._4_4_ < ref_node_00->max)) &&
             (-1 < ref_node_00->global[metric_imply._4_4_])) {
            uVar1 = ref_matrix_diag_m(metric_00 + metric_imply._4_4_ * 6,&hmin);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xda8,"ref_metric_isotropic",(ulong)uVar1,"eigen decomp");
              return uVar1;
            }
            if (hmin <= d_imply[0]) {
              local_150 = d_imply[0];
            }
            else {
              local_150 = hmin;
            }
            if (local_150 <= d_imply[0]) {
              local_160 = d_imply[0];
            }
            else {
              if (hmin <= d_imply[0]) {
                local_158 = d_imply[0];
              }
              else {
                local_158 = hmin;
              }
              local_160 = local_158;
            }
            if (local_160 < 0.0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xdab,"ref_metric_isotropic","neg eig");
              return 1;
            }
            dVar2 = sqrt(local_160);
            if (dVar2 * 1e+20 <= 0.0) {
              dVar2 = sqrt(local_160);
              local_168 = -(dVar2 * 1e+20);
            }
            else {
              local_168 = sqrt(local_160);
              local_168 = local_168 * 1e+20;
            }
            if (local_168 <= 1.0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xdac,"ref_metric_isotropic","div zero");
              return 1;
            }
            dVar2 = sqrt(local_160);
            dVar2 = 1.0 / dVar2;
            if (d_imply[0] <= hmin) {
              local_170 = d_imply[0];
            }
            else {
              local_170 = hmin;
            }
            if (d_imply[0] <= local_170) {
              local_180 = d_imply[0];
            }
            else {
              if (d_imply[0] <= hmin) {
                local_178 = d_imply[0];
              }
              else {
                local_178 = hmin;
              }
              local_180 = local_178;
            }
            if (local_180 < 0.0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xdb1,"ref_metric_isotropic","neg eig");
              return 1;
            }
            dVar3 = sqrt(local_180);
            if (dVar3 * 1e+20 <= 0.0) {
              dVar3 = sqrt(local_180);
              local_188 = -(dVar3 * 1e+20);
            }
            else {
              local_188 = sqrt(local_180);
              local_188 = local_188 * 1e+20;
            }
            if (local_188 <= 1.0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xdb2,"ref_metric_isotropic","div zero");
              return 1;
            }
            dVar3 = sqrt(local_180);
            d_met[0xb] = 1.0 / dVar3;
            if (d_met[0xb] * 1e+20 <= 0.0) {
              local_190 = -(d_met[0xb] * 1e+20);
            }
            else {
              local_190 = d_met[0xb] * 1e+20;
            }
            local_1a0 = dVar2;
            if (dVar2 <= 0.0) {
              local_1a0 = -dVar2;
            }
            if (local_190 <= local_1a0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xdb5,"ref_metric_isotropic","div zero");
              return 1;
            }
            dVar2 = dVar2 / d_met[0xb];
            uVar1 = ref_matrix_diag_m(metric + metric_imply._4_4_ * 6,&h);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xdb8,"ref_metric_isotropic",(ulong)uVar1,"eigen decomp");
              return uVar1;
            }
            uVar1 = ref_matrix_descending_eig(&h);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xdb9,"ref_metric_isotropic",(ulong)uVar1,"really descend?");
              return uVar1;
            }
            if (0.5 <= dVar2) {
              local_50 = h;
            }
            else {
              local_50 = d_met[0];
            }
            if (local_50 < 0.0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xdbf,"ref_metric_isotropic","neg eig");
              return 1;
            }
            dVar2 = sqrt(local_50);
            if (dVar2 * 1e+20 <= 0.0) {
              dVar2 = sqrt(local_50);
              local_1a8 = -(dVar2 * 1e+20);
            }
            else {
              local_1a8 = sqrt(local_50);
              local_1a8 = local_1a8 * 1e+20;
            }
            if (local_1a8 <= 1.0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xdc0,"ref_metric_isotropic","div zero");
              return 1;
            }
            dVar2 = sqrt(local_50);
            hh[metric_imply._4_4_ << 1] = 1.0 / dVar2;
            hh[metric_imply._4_4_ * 2 + 1] = 0.5;
          }
        }
        metric_local._4_4_ = ref_node_ghost_dbl(ref_node_00,hh,2);
        if (metric_local._4_4_ == 0) {
          if (metric_00 != (REF_DBL *)0x0) {
            free(metric_00);
          }
          metric_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xdc7,"ref_metric_isotropic",(ulong)metric_local._4_4_,"update ghosts");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xda2,"ref_metric_isotropic",(ulong)metric_local._4_4_,"imply");
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_isotropic(REF_DBL *metric, REF_GRID ref_grid,
                                        REF_DBL *hh) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_DBL *metric_imply;
  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  RSS(ref_metric_imply_from(metric_imply, ref_grid), "imply");

  each_ref_node_valid_node(ref_node, node) {
    REF_DBL e, d_imply[12], hmin, hmax, d_met[12], h;
    REF_DBL ar;

    RSS(ref_matrix_diag_m(&(metric_imply[6 * node]), d_imply), "eigen decomp");
    e = MAX(MAX(ref_matrix_eig(d_imply, 0), ref_matrix_eig(d_imply, 1)),
            ref_matrix_eig(d_imply, 1));
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    hmin = 1.0 / sqrt(e);

    e = MIN(MIN(ref_matrix_eig(d_imply, 0), ref_matrix_eig(d_imply, 1)),
            ref_matrix_eig(d_imply, 1));
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    hmax = 1.0 / sqrt(e);

    RAS(ref_math_divisible(hmin, hmax), "div zero");
    ar = hmin / hmax;

    RSS(ref_matrix_diag_m(&(metric[6 * node]), d_met), "eigen decomp");
    RSS(ref_matrix_descending_eig(d_met), "really descend?");
    if (ar < 0.5) {
      e = ref_matrix_eig(d_met, 1);
    } else {
      e = ref_matrix_eig(d_met, 0);
    }
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    h = 1.0 / sqrt(e);

    hh[0 + 2 * node] = h;
    hh[1 + 2 * node] = 0.5; /* CADENCE/Pointwise typical decay rate */
  }

  RSS(ref_node_ghost_dbl(ref_node, hh, 2), "update ghosts");

  ref_free(metric_imply);

  return REF_SUCCESS;
}